

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# casts.h
# Opt level: O1

void __thiscall
CoreML::Specification::MILSpec::ValueType::CheckTypeAndMergeFrom(ValueType *this,MessageLite *from)

{
  ulong uVar1;
  LogMessage *other;
  TensorType *pTVar2;
  StateType *pSVar3;
  TupleType *pTVar4;
  DictionaryType *pDVar5;
  ListType *pLVar6;
  undefined1 *puVar7;
  Arena *pAVar8;
  LogFinisher LStack_51;
  LogMessage LStack_50;
  
  if (from->_vptr_MessageLite == (_func_int **)&PTR__ValueType_004b19a8) {
    if ((ValueType *)from == this) {
      google::protobuf::internal::LogMessage::LogMessage
                (&LStack_50,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O1/mlmodel/format/MIL.pb.cc"
                 ,0xcd8);
      other = google::protobuf::internal::LogMessage::operator<<
                        (&LStack_50,"CHECK failed: (&from) != (this): ");
      google::protobuf::internal::LogFinisher::operator=(&LStack_51,other);
      google::protobuf::internal::LogMessage::~LogMessage(&LStack_50);
    }
    switch(*(undefined4 *)((long)&from[1]._internal_metadata_.ptr_ + 4)) {
    case 1:
      if (this->_oneof_case_[0] != 1) {
        clear_type(this);
        this->_oneof_case_[0] = 1;
        uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
        pAVar8 = (Arena *)(uVar1 & 0xfffffffffffffffc);
        if ((uVar1 & 1) != 0) {
          pAVar8 = *(Arena **)pAVar8;
        }
        pTVar2 = google::protobuf::Arena::
                 CreateMaybeMessage<CoreML::Specification::MILSpec::TensorType>(pAVar8);
        (this->type_).tensortype_ = pTVar2;
      }
      if (*(int *)((long)&from[1]._internal_metadata_.ptr_ + 4) == 1) {
        puVar7 = (undefined1 *)from[1]._vptr_MessageLite;
      }
      else {
        puVar7 = _TensorType_default_instance_;
      }
      TensorType::MergeFrom((this->type_).tensortype_,(TensorType *)puVar7);
      break;
    case 2:
      if (this->_oneof_case_[0] != 2) {
        clear_type(this);
        this->_oneof_case_[0] = 2;
        uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
        pAVar8 = (Arena *)(uVar1 & 0xfffffffffffffffc);
        if ((uVar1 & 1) != 0) {
          pAVar8 = *(Arena **)pAVar8;
        }
        pLVar6 = google::protobuf::Arena::
                 CreateMaybeMessage<CoreML::Specification::MILSpec::ListType>(pAVar8);
        (this->type_).listtype_ = pLVar6;
      }
      if (*(int *)((long)&from[1]._internal_metadata_.ptr_ + 4) == 2) {
        puVar7 = (undefined1 *)from[1]._vptr_MessageLite;
      }
      else {
        puVar7 = _ListType_default_instance_;
      }
      ListType::MergeFrom((this->type_).listtype_,(ListType *)puVar7);
      break;
    case 3:
      if (this->_oneof_case_[0] != 3) {
        clear_type(this);
        this->_oneof_case_[0] = 3;
        uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
        pAVar8 = (Arena *)(uVar1 & 0xfffffffffffffffc);
        if ((uVar1 & 1) != 0) {
          pAVar8 = *(Arena **)pAVar8;
        }
        pTVar4 = google::protobuf::Arena::
                 CreateMaybeMessage<CoreML::Specification::MILSpec::TupleType>(pAVar8);
        (this->type_).tupletype_ = pTVar4;
      }
      if (*(int *)((long)&from[1]._internal_metadata_.ptr_ + 4) == 3) {
        puVar7 = (undefined1 *)from[1]._vptr_MessageLite;
      }
      else {
        puVar7 = _TupleType_default_instance_;
      }
      TupleType::MergeFrom((this->type_).tupletype_,(TupleType *)puVar7);
      break;
    case 4:
      if (this->_oneof_case_[0] != 4) {
        clear_type(this);
        this->_oneof_case_[0] = 4;
        uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
        pAVar8 = (Arena *)(uVar1 & 0xfffffffffffffffc);
        if ((uVar1 & 1) != 0) {
          pAVar8 = *(Arena **)pAVar8;
        }
        pDVar5 = google::protobuf::Arena::
                 CreateMaybeMessage<CoreML::Specification::MILSpec::DictionaryType>(pAVar8);
        (this->type_).dictionarytype_ = pDVar5;
      }
      if (*(int *)((long)&from[1]._internal_metadata_.ptr_ + 4) == 4) {
        puVar7 = (undefined1 *)from[1]._vptr_MessageLite;
      }
      else {
        puVar7 = _DictionaryType_default_instance_;
      }
      DictionaryType::MergeFrom((this->type_).dictionarytype_,(DictionaryType *)puVar7);
      break;
    case 5:
      if (this->_oneof_case_[0] != 5) {
        clear_type(this);
        this->_oneof_case_[0] = 5;
        uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
        pAVar8 = (Arena *)(uVar1 & 0xfffffffffffffffc);
        if ((uVar1 & 1) != 0) {
          pAVar8 = *(Arena **)pAVar8;
        }
        pSVar3 = google::protobuf::Arena::
                 CreateMaybeMessage<CoreML::Specification::MILSpec::StateType>(pAVar8);
        (this->type_).statetype_ = pSVar3;
      }
      if (*(int *)((long)&from[1]._internal_metadata_.ptr_ + 4) == 5) {
        puVar7 = (undefined1 *)from[1]._vptr_MessageLite;
      }
      else {
        puVar7 = _StateType_default_instance_;
      }
      StateType::MergeFrom((this->type_).statetype_,(StateType *)puVar7);
    }
    uVar1 = (from->_internal_metadata_).ptr_;
    if ((uVar1 & 1) != 0) {
      google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
                (&(this->super_MessageLite)._internal_metadata_,
                 (string *)((uVar1 & 0xfffffffffffffffc) + 8));
    }
    return;
  }
  __assert_fail("f == nullptr || dynamic_cast<To>(f) != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/stubs/casts.h"
                ,0x5e,
                "To google::protobuf::internal::down_cast(From *) [To = const CoreML::Specification::MILSpec::ValueType *, From = const google::protobuf::MessageLite]"
               );
}

Assistant:

inline To down_cast(From* f) {                   // so we only accept pointers
  // Ensures that To is a sub-type of From *.  This test is here only
  // for compile-time type checking, and has no overhead in an
  // optimized build at run-time, as it will be optimized away
  // completely.
  if (false) {
    implicit_cast<From*, To>(0);
  }

#if !defined(NDEBUG) && PROTOBUF_RTTI
  assert(f == nullptr || dynamic_cast<To>(f) != nullptr);  // RTTI: debug mode only!
#endif
  return static_cast<To>(f);
}